

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O0

void __thiscall
CVmObjIntClsMod::build_prop_list(CVmObjIntClsMod *this,vm_obj_id_t self,vm_val_t *retval)

{
  ushort uVar1;
  int iVar2;
  vm_val_t *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CVmObject *pCVar4;
  vm_val_t *in_RDX;
  vm_obj_id_t in_ESI;
  CVmObjTads *in_RDI;
  CVmObjTads *unaff_retaddr;
  vm_val_t base_val;
  CVmObject *base_obj;
  vm_obj_id_t base_id;
  undefined8 in_stack_ffffffffffffffb8;
  uint n;
  undefined1 local_38 [16];
  CVmObject *local_28;
  vm_obj_id_t local_1c;
  vm_val_t *local_18;
  undefined4 in_stack_fffffffffffffff0;
  CVmObjTads *pCVar5;
  long lVar3;
  vm_obj_id_t self_00;
  
  n = (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_18 = in_RDX;
  pCVar5 = in_RDI;
  this_00 = CVmStack::push();
  self_00 = (vm_obj_id_t)((ulong)pCVar5 >> 0x20);
  vm_val_t::set_obj(this_00,in_ESI);
  CVmObjTads::build_prop_list
            (unaff_retaddr,self_00,(vm_val_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  uVar1 = CVmObjTads::get_sc_count((CVmObjTads *)0x39c55a);
  if (uVar1 != 0) {
    local_1c = CVmObjTads::get_sc(in_RDI,n);
    local_28 = vm_objp(0);
    iVar2 = (**local_28->_vptr_CVmObject)();
    lVar3 = CONCAT44(extraout_var,iVar2);
    iVar2 = (**(in_RDI->super_CVmObject)._vptr_CVmObject)();
    if (lVar3 == CONCAT44(extraout_var_00,iVar2)) {
      CVmStack::push(local_18);
      (*local_28->_vptr_CVmObject[0x10])(local_28,(ulong)local_1c,local_38);
      pCVar4 = vm_objp(0);
      (*pCVar4->_vptr_CVmObject[0x22])(pCVar4,local_18,(ulong)(local_18->val).obj,local_38);
      CVmStack::discard();
    }
  }
  CVmStack::discard();
  return;
}

Assistant:

void CVmObjIntClsMod::build_prop_list(VMG_ vm_obj_id_t self, vm_val_t *retval)
{
    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* build our own list */
    CVmObjTads::build_prop_list(vmg_ self, retval);

    /* if we have a base class that we further modify, add its list */
    if (get_sc_count() != 0)
    {
        vm_obj_id_t base_id;
        CVmObject *base_obj;

        /* get the base class */
        base_id = get_sc(0);
        base_obj = vm_objp(vmg_ base_id);

        /* get its list only if it's of our same metaclass */
        if (base_obj->get_metaclass_reg() == get_metaclass_reg())
        {
            vm_val_t base_val;

            /* save our list for gc protection */
            G_stk->push(retval);

            /* get our base class's list */
            base_obj->build_prop_list(vmg_ base_id, &base_val);

            /* add this list to our result list */
            vm_objp(vmg_ retval->val.obj)->
                add_val(vmg_ retval, retval->val.obj, &base_val);

            /* discard our gc protection */
            G_stk->discard();
        }
    }

    /* discard gc protection */
    G_stk->discard();
}